

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O1

weak_ptr<squall::detail::KlassImp<Foo>_> __thiscall
squall::KlassTable::add_klass<Foo,void>(KlassTable *this,HSQUIRRELVM vm,string *name)

{
  ulong uVar1;
  _func_int *p_Var2;
  mapped_type *pmVar3;
  __buckets_ptr pp_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  ulong uVar5;
  ulong uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _func_int *p_Var8;
  _func_int *p_Var9;
  long lVar10;
  undefined1 auVar11 [16];
  weak_ptr<squall::detail::KlassImp<Foo>_> wVar12;
  shared_ptr<squall::detail::KlassImp<Foo>_> p;
  size_t h;
  undefined1 local_49;
  KlassImp<Foo> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  size_t local_38;
  SQVM *local_30;
  
  local_38 = std::type_info::hash_code((type_info *)&detail::KlassImp<Foo>::typeinfo);
  uVar1 = (vm->super_SQCollectable).super_SQRefCounted._uiRef;
  uVar5 = local_38 % uVar1;
  p_Var8 = (vm->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[uVar5];
  uVar6 = uVar5;
  p_Var9 = (_func_int *)0x0;
  if ((p_Var8 != (_func_int *)0x0) &&
     (p_Var2 = *(_func_int **)p_Var8, p_Var9 = p_Var8,
     local_38 != *(size_t *)(*(_func_int **)p_Var8 + 8))) {
    while (p_Var8 = p_Var2, p_Var2 = *(_func_int **)p_Var8, p_Var2 != (_func_int *)0x0) {
      uVar6 = *(ulong *)(p_Var2 + 8) % uVar1;
      p_Var9 = (_func_int *)0x0;
      if ((uVar6 != uVar5) || (p_Var9 = p_Var8, local_38 == *(ulong *)(p_Var2 + 8)))
      goto LAB_001071b7;
    }
    p_Var9 = (_func_int *)0x0;
  }
LAB_001071b7:
  if (p_Var9 == (_func_int *)0x0) {
    lVar10 = 0;
  }
  else {
    lVar10 = *(long *)p_Var9;
  }
  if (lVar10 == 0) {
    local_48 = (KlassImp<Foo> *)0x0;
    local_30 = (SQVM *)name;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<squall::detail::KlassImp<Foo>,std::allocator<squall::detail::KlassImp<Foo>>,SQVM*&,std::__cxx11::string_const&>
              (&local_40,&local_48,(allocator<squall::detail::KlassImp<Foo>_> *)&local_49,&local_30,
               in_RCX);
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)vm,&local_38);
    (pmVar3->super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         &local_48->super_KlassImpBase;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->
                super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&local_40);
    (this->klasses_)._M_h._M_buckets = (__buckets_ptr)local_48;
    (this->klasses_)._M_h._M_bucket_count = (size_type)local_40._M_pi;
    _Var7._M_pi = extraout_RDX;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
      }
    }
  }
  else {
    if (*(long *)(lVar10 + 0x10) == 0) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar6;
      auVar11 = auVar11 << 0x40;
    }
    else {
      auVar11 = __dynamic_cast(*(long *)(lVar10 + 0x10),&detail::KlassImpBase::typeinfo,
                               &detail::KlassImp<Foo>::typeinfo,0);
    }
    _Var7._M_pi = auVar11._8_8_;
    pp_Var4 = auVar11._0_8_;
    if (pp_Var4 == (__buckets_ptr)0x0) {
      pp_Var4 = (__buckets_ptr)0x0;
      local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_40._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 0x18);
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
        }
      }
    }
    (this->klasses_)._M_h._M_buckets = pp_Var4;
    (this->klasses_)._M_h._M_bucket_count = (size_type)local_40._M_pi;
    if (local_40._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001072c4;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
    }
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    _Var7._M_pi = extraout_RDX_00;
  }
LAB_001072c4:
  wVar12.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  wVar12.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<squall::detail::KlassImp<Foo>_>)
         wVar12.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<detail::KlassImp<typename std::remove_cv<C>::type>>
    add_klass(HSQUIRRELVM vm, const string& name) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            auto p = KlassAdd<CC, Base>::doit(klasses_, vm, name);
            klasses_[h] = p;
            return p;
        } else {
            return std::dynamic_pointer_cast<detail::KlassImp<CC>>(
                (*i).second);
        }
    }